

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

int container_at(int x,int y,boolean countem)

{
  vptrs *pvVar1;
  short *psVar2;
  int iVar3;
  obj *poVar4;
  
  iVar3 = 0;
  if ((level->locations[x][y].typ == '\x1e') && (iVar3 = 1, countem == '\0')) {
    return 1;
  }
  poVar4 = level->objects[x][y];
  do {
    if (poVar4 == (obj *)0x0) {
      return iVar3;
    }
    pvVar1 = &poVar4->v;
    psVar2 = &poVar4->otyp;
    poVar4 = pvVar1->v_nexthere;
  } while ((7 < (ushort)(*psVar2 - 0xdaU)) || (iVar3 = iVar3 + 1, countem != '\0'));
  return iVar3;
}

Assistant:

static int container_at(int x, int y, boolean countem)
{
	struct obj *cobj, *nobj;
	int container_count = 0;

	/*
	 * WARNING: Magic chests are terrain features, not objects, so a
	 * non-zero return value from this function doesn't necessarily mean
	 * there's an object at this location.
	 */
	if (IS_MAGIC_CHEST(level->locations[x][y].typ)) {
		if (countem)
			container_count++;
		else
			return 1;
	}

	for (cobj = level->objects[x][y]; cobj; cobj = nobj) {
		nobj = cobj->nexthere;
		if (Is_container(cobj)) {
			container_count++;
			if (!countem) break;
		}
	}
	return container_count;
}